

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ShapeRange * __thiscall
CoreML::ShapeRange::unify(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  bool bVar1;
  RangeValue RVar2;
  RangeValue local_58;
  RangeValue local_48;
  RangeValue local_38;
  RangeValue local_28;
  ShapeRange *local_18;
  ShapeRange *other_local;
  ShapeRange *this_local;
  
  local_18 = other;
  other_local = this;
  ShapeRange(__return_storage_ptr__);
  RVar2 = minimum(local_18);
  local_28._val = RVar2._val;
  local_28._isUnbound = RVar2._isUnbound;
  bVar1 = RangeValue::operator<=(&this->_minimum,&local_28);
  if (bVar1) {
    setLower(__return_storage_ptr__,&this->_minimum);
  }
  else {
    RVar2 = minimum(local_18);
    local_38._val = RVar2._val;
    local_38._isUnbound = RVar2._isUnbound;
    setLower(__return_storage_ptr__,&local_38);
  }
  RVar2 = maximum(local_18);
  local_48._val = RVar2._val;
  local_48._isUnbound = RVar2._isUnbound;
  bVar1 = RangeValue::operator>=(&this->_maximum,&local_48);
  if (bVar1) {
    setUpper(__return_storage_ptr__,&this->_maximum);
  }
  else {
    RVar2 = maximum(local_18);
    local_58._val = RVar2._val;
    local_58._isUnbound = RVar2._isUnbound;
    setUpper(__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::unify(const ShapeRange& other) const {
    ShapeRange out;

    if (_minimum <= other.minimum())
        out.setLower(_minimum);
    else
        out.setLower(other.minimum());

    if (_maximum >= other.maximum())
        out.setUpper(_maximum);
    else
        out.setUpper(other.maximum());

    return out;
}